

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O0

void remove_mon(coord *mp,MonsterThing *tp,bool waskill)

{
  int x;
  int y;
  MonsterThing *pMVar1;
  bool bVar2;
  int display_char;
  reference ppIVar3;
  _List_iterator<ItemThing_*> local_40;
  ItemThing *local_38;
  ItemThing *obj;
  _Self local_28;
  iterator it;
  MonsterThing *pMStack_18;
  bool waskill_local;
  MonsterThing *tp_local;
  coord *mp_local;
  
  it._M_node._7_1_ = waskill;
  pMStack_18 = tp;
  tp_local = (MonsterThing *)mp;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::begin(&tp->pack);
  while( true ) {
    obj = (ItemThing *)
          std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::end(&pMStack_18->pack);
    bVar2 = std::operator!=(&local_28,(_Self *)&obj);
    if (!bVar2) break;
    local_40._M_node = (_List_node_base *)std::_List_iterator<ItemThing_*>::operator++(&local_28,0);
    ppIVar3 = std::_List_iterator<ItemThing_*>::operator*(&local_40);
    local_38 = *ppIVar3;
    local_38->pos = pMStack_18->pos;
    std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::remove
              (&pMStack_18->pack,(char *)&local_38);
    if ((it._M_node._7_1_ & 1) == 0) {
      if (local_38 != (ItemThing *)0x0) {
        operator_delete(local_38);
      }
    }
    else {
      fall(local_38,false);
    }
  }
  places[(tp_local->pos).x * 0x20 + (tp_local->pos).y].p_monst = (MonsterThing *)0x0;
  std::__cxx11::list<MonsterThing_*,_std::allocator<MonsterThing_*>_>::remove
            (&mlist_abi_cxx11_,(char *)&stack0xffffffffffffffe8);
  bVar2 = see_monst(pMStack_18);
  if (bVar2) {
    x = (tp_local->pos).x;
    y = (tp_local->pos).y;
    display_char = char_at_place((tp_local->pos).x,(tp_local->pos).y);
    setMapDisplay(x,y,display_char);
  }
  if ((pMStack_18->flags & 0x80U) != 0) {
    kamikaze = false;
    to_death = false;
    if ((fight_flush & 1U) != 0) {
      flush_type();
    }
  }
  pMVar1 = pMStack_18;
  if (pMStack_18 != (MonsterThing *)0x0) {
    MonsterThing::~MonsterThing(pMStack_18);
    operator_delete(pMVar1);
  }
  return;
}

Assistant:

void remove_mon(coord *mp, MonsterThing *tp, bool waskill)
{
    for(auto it = tp->pack.begin(); it != tp->pack.end(); )
    {
        ItemThing* obj = *it++;
        obj->pos = tp->pos;
        tp->pack.remove(obj);
        if (waskill)
            fall(obj, false);
        else
            delete obj;
    }
    monster_at(mp->x, mp->y) = nullptr;
    mlist.remove(tp);
    if (see_monst(tp))
        setMapDisplay(mp->x, mp->y, char_at_place(mp->x, mp->y));
    if (on(*tp, ISTARGET))
    {
        kamikaze = false;
        to_death = false;
        if (fight_flush)
            flush_type();
    }
    delete tp;
}